

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void copy_recurse_data(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int type,
                      int stackptr,int stacktop,BOOL has_quit)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  sljit_s32 sVar6;
  int iVar7;
  bool bVar8;
  uint local_f4;
  BOOL control_head_found;
  BOOL capture_last_found;
  BOOL setmark_found;
  BOOL setsom_found;
  int i;
  int offset;
  int base_reg;
  int from_sp;
  int kept_shared_count;
  int shared_count;
  int private_count;
  sljit_sw kept_shared_srcw [2];
  sljit_sw shared_srcw [3];
  sljit_sw private_srcw [2];
  PCRE2_SPTR16 alternative;
  delayed_mem_copy_status status;
  int local_28;
  int stacktop_local;
  int stackptr_local;
  int type_local;
  PCRE2_SPTR16 ccend_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  if (type == 0) {
    bVar1 = true;
    i = 0xc;
  }
  else if (type - 1U < 3) {
    bVar1 = false;
    i = 0xc;
  }
  else {
    bVar1 = false;
    i = 4;
  }
  local_28 = stackptr * 8;
  status._60_4_ = stacktop << 3;
  status.store_offsets[1] = 1;
  status.tmp_regs[1] = 1;
  if (i == 4) {
    status.tmp_regs[2] = 5;
    sVar6 = sljit_get_register_index(5);
    if (sVar6 == -1) {
      status.store_offsets[2] = 2;
    }
    else {
      status.store_offsets[2] = 5;
    }
  }
  else {
    status.store_offsets[2] = 4;
    status.tmp_regs[2] = 4;
  }
  status.saved_tmp_regs[0] = 3;
  sVar6 = sljit_get_register_index(3);
  if (sVar6 == -1) {
    status.tmp_regs[0] = 0xd;
  }
  else {
    status.tmp_regs[0] = 3;
  }
  delayed_mem_copy_init((delayed_mem_copy_status *)&alternative,common);
  if (((type != 2) && (type != 3)) &&
     ((bVar1 || (delayed_mem_copy_move
                           ((delayed_mem_copy_status *)&alternative,i,(long)local_28,0xe,
                            (long)common->recursive_head_ptr), type == 4)))) {
    delayed_mem_copy_move
              ((delayed_mem_copy_status *)&alternative,0xe,(long)common->recursive_head_ptr,i,
               (long)local_28);
  }
  local_28 = local_28 + 8;
  ccend_local = cc;
  while (ccend_local < ccend) {
    kept_shared_count = 0;
    from_sp = 0;
    base_reg = 0;
    switch(*ccend_local) {
    case 3:
      if ((has_quit != 0) && (!bVar2)) {
        _shared_count = (long)common->ovector_start;
        base_reg = 1;
        bVar2 = true;
      }
      ccend_local = ccend_local + 1;
      break;
    default:
      ccend_local = next_opcode(common,ccend_local);
      break;
    case 0x21:
    case 0x23:
    case 0x2e:
    case 0x30:
    case 0x3b:
    case 0x3d:
    case 0x48:
    case 0x4a:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        kept_shared_count = 2;
        private_srcw[0] =
             (long)common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] + 8;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x22:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2f:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x3c:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x49:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      kept_shared_count =
           (int)(common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0);
      ccend_local = ccend_local + 2;
      break;
    case 0x27:
    case 0x28:
    case 0x34:
    case 0x35:
    case 0x41:
    case 0x42:
    case 0x4e:
    case 0x4f:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        kept_shared_count = 2;
        private_srcw[0] =
             (long)common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] + 8;
      }
      ccend_local = ccend_local + 3;
      break;
    case 0x55:
    case 0x57:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        kept_shared_count = 2;
        private_srcw[0] =
             (long)common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] + 8;
      }
      ccend_local = ccend_local + 1;
      break;
    case 0x56:
    case 0x58:
    case 0x59:
    case 0x5a:
      kept_shared_count =
           (int)(common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0);
      ccend_local = ccend_local + 1;
      break;
    case 0x5b:
    case 0x5c:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        kept_shared_count = 2;
        private_srcw[0] =
             (long)common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] + 8;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
      if (*ccend_local == 0x70) {
        local_f4 = (uint)ccend_local[1];
      }
      else {
        local_f4 = 0x11;
      }
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        iVar7 = get_class_iterator_size(ccend_local + (int)local_f4);
        if (iVar7 == 1) {
          kept_shared_count = 1;
        }
        else if (iVar7 == 2) {
          kept_shared_count = 2;
          private_srcw[0] =
               (long)common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] + 8;
        }
      }
      ccend_local = ccend_local + (int)local_f4;
      break;
    case 0x75:
      if (has_quit != 0) {
        if ((common->has_set_som != 0) && (!bVar2)) {
          _shared_count = (long)common->ovector_start;
          base_reg = 1;
          bVar2 = true;
        }
        if ((common->mark_ptr != 0) && (!bVar3)) {
          *(long *)(&shared_count + (long)base_reg * 2) = (long)common->mark_ptr;
          base_reg = base_reg + 1;
          bVar3 = true;
        }
      }
      if ((common->capture_last_ptr != 0) && (!bVar4)) {
        kept_shared_srcw[1] = (long)common->capture_last_ptr;
        from_sp = 1;
        bVar4 = true;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x79:
      bVar8 = common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0;
      if (bVar8) {
        ccend_local = ccend_local +
                      common->private_data_ptrs[(long)ccend_local + (2 - (long)common->start) >> 1];
      }
      kept_shared_count = (int)bVar8;
      ccend_local = ccend_local + 2;
      break;
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x84:
    case 0x88:
    case 0x89:
    case 0x8c:
      kept_shared_count = 1;
      ccend_local = ccend_local + 2;
      break;
    case 0x85:
    case 0x8a:
      kept_shared_srcw[1] = (long)common->ovector_start + (long)(int)((uint)ccend_local[2] * 2) * 8;
      from_sp = 2;
      if ((common->capture_last_ptr != 0) && (!bVar4)) {
        from_sp = 3;
        bVar4 = true;
      }
      kept_shared_count = (int)(common->optimized_cbracket[ccend_local[2]] == '\0');
      ccend_local = ccend_local + 3;
      break;
    case 0x86:
    case 0x8b:
      kept_shared_srcw[1] = (long)common->ovector_start + (long)(int)((uint)ccend_local[2] * 2) * 8;
      from_sp = 2;
      if ((common->capture_last_ptr != 0) && (!bVar4)) {
        from_sp = 3;
        bVar4 = true;
      }
      kept_shared_count = 2;
      private_srcw[0] = (long)common->cbra_ptr + (ulong)ccend_local[2] * 8;
      ccend_local = ccend_local + 3;
      break;
    case 0x87:
      private_srcw[1] = (sljit_sw)(ccend_local + (int)(uint)ccend_local[1]);
      if ((*(PCRE2_UCHAR16 *)private_srcw[1] == 0x7a) || (*(PCRE2_UCHAR16 *)private_srcw[1] == 0x7b)
         ) {
        kept_shared_count = 1;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x96:
    case 0x98:
    case 0x9c:
    case 0x9e:
      if ((has_quit != 0) && (!bVar3)) {
        _shared_count = (long)common->mark_ptr;
        base_reg = 1;
        bVar3 = true;
      }
      if ((common->control_head_ptr != 0) && (!bVar5)) {
        kept_shared_srcw[1] = (long)common->control_head_ptr;
        from_sp = 1;
        bVar5 = true;
      }
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
      break;
    case 0x9b:
      bVar8 = !bVar5;
      if (bVar8) {
        kept_shared_srcw[1] = (long)common->control_head_ptr;
        bVar5 = true;
      }
      from_sp = (int)bVar8;
      ccend_local = ccend_local + 1;
    }
    if ((type == 2) || (type == 3)) {
      local_28 = local_28 + kept_shared_count * 8;
    }
    else {
      for (setmark_found = 0; setmark_found < kept_shared_count; setmark_found = setmark_found + 1)
      {
        if ((bVar1) ||
           (delayed_mem_copy_move
                      ((delayed_mem_copy_status *)&alternative,i,(long)local_28,0xe,
                       private_srcw[(long)setmark_found + -1]), type == 4)) {
          delayed_mem_copy_move
                    ((delayed_mem_copy_status *)&alternative,0xe,
                     private_srcw[(long)setmark_found + -1],i,(long)local_28);
        }
        local_28 = local_28 + 8;
      }
    }
    if ((type == 1) || (type == 3)) {
      local_28 = local_28 + from_sp * 8;
    }
    else {
      for (setmark_found = 0; setmark_found < from_sp; setmark_found = setmark_found + 1) {
        if ((bVar1) ||
           (delayed_mem_copy_move
                      ((delayed_mem_copy_status *)&alternative,i,(long)local_28,0xe,
                       kept_shared_srcw[(long)setmark_found + 1]), type == 4)) {
          delayed_mem_copy_move
                    ((delayed_mem_copy_status *)&alternative,0xe,
                     kept_shared_srcw[(long)setmark_found + 1],i,(long)local_28);
        }
        local_28 = local_28 + 8;
      }
    }
    if ((type == 1) || (type == 4)) {
      local_28 = local_28 + base_reg * 8;
    }
    else {
      for (setmark_found = 0; setmark_found < base_reg; setmark_found = setmark_found + 1) {
        if ((bVar1) ||
           (delayed_mem_copy_move
                      ((delayed_mem_copy_status *)&alternative,i,(long)local_28,0xe,
                       *(sljit_sw *)(&shared_count + (long)setmark_found * 2)), type == 4)) {
          delayed_mem_copy_move
                    ((delayed_mem_copy_status *)&alternative,0xe,
                     *(sljit_sw *)(&shared_count + (long)setmark_found * 2),i,(long)local_28);
        }
        local_28 = local_28 + 8;
      }
    }
  }
  delayed_mem_copy_finish((delayed_mem_copy_status *)&alternative);
  return;
}

Assistant:

static void copy_recurse_data(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend,
  int type, int stackptr, int stacktop, BOOL has_quit)
{
delayed_mem_copy_status status;
PCRE2_SPTR alternative;
sljit_sw private_srcw[2];
sljit_sw shared_srcw[3];
sljit_sw kept_shared_srcw[2];
int private_count, shared_count, kept_shared_count;
int from_sp, base_reg, offset, i;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
BOOL capture_last_found = FALSE;
BOOL control_head_found = FALSE;

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
SLJIT_ASSERT(common->control_head_ptr != 0);
control_head_found = TRUE;
#endif

switch (type)
  {
  case recurse_copy_from_global:
  from_sp = TRUE;
  base_reg = STACK_TOP;
  break;

  case recurse_copy_private_to_global:
  case recurse_copy_shared_to_global:
  case recurse_copy_kept_shared_to_global:
  from_sp = FALSE;
  base_reg = STACK_TOP;
  break;

  default:
  SLJIT_ASSERT(type == recurse_swap_global);
  from_sp = FALSE;
  base_reg = TMP2;
  break;
  }

stackptr = STACK(stackptr);
stacktop = STACK(stacktop);

status.tmp_regs[0] = TMP1;
status.saved_tmp_regs[0] = TMP1;

if (base_reg != TMP2)
  {
  status.tmp_regs[1] = TMP2;
  status.saved_tmp_regs[1] = TMP2;
  }
else
  {
  status.saved_tmp_regs[1] = RETURN_ADDR;
  if (sljit_get_register_index (RETURN_ADDR) == -1)
    status.tmp_regs[1] = STR_PTR;
  else
    status.tmp_regs[1] = RETURN_ADDR;
  }

status.saved_tmp_regs[2] = TMP3;
if (sljit_get_register_index (TMP3) == -1)
  status.tmp_regs[2] = STR_END;
else
  status.tmp_regs[2] = TMP3;

delayed_mem_copy_init(&status, common);

if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
  {
  SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->recursive_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->recursive_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
if (type != recurse_copy_shared_to_global)
  {
  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->control_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->control_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);
#endif

while (cc < ccend)
  {
  private_count = 0;
  shared_count = 0;
  kept_shared_count = 0;

  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (has_quit && !setsom_found)
      {
      kept_shared_srcw[0] = OVECTOR(0);
      kept_shared_count = 1;
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_RECURSE:
    if (has_quit)
      {
      if (common->has_set_som && !setsom_found)
        {
        kept_shared_srcw[0] = OVECTOR(0);
        kept_shared_count = 1;
        setsom_found = TRUE;
        }
      if (common->mark_ptr != 0 && !setmark_found)
        {
        kept_shared_srcw[kept_shared_count] = common->mark_ptr;
        kept_shared_count++;
        setmark_found = TRUE;
        }
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[0] = common->capture_last_ptr;
      shared_count = 1;
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_KET:
    if (PRIVATE_DATA(cc) != 0)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      SLJIT_ASSERT(PRIVATE_DATA(cc + 1) != 0);
      cc += PRIVATE_DATA(cc + 1);
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ONCE:
    case OP_BRAPOS:
    case OP_SBRA:
    case OP_SBRAPOS:
    case OP_SCOND:
    private_count = 1;
    private_srcw[0] = PRIVATE_DATA(cc);
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_SCBRA:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    if (common->optimized_cbracket[GET2(cc, 1 + LINK_SIZE)] == 0)
      {
      private_count = 1;
      private_srcw[0] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
      }
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    private_count = 2;
    private_srcw[0] = PRIVATE_DATA(cc);
    private_srcw[1] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_COND:
    /* Might be a hidden SCOND. */
    alternative = cc + GET(cc, 1);
    if (*alternative == OP_KETRMAX || *alternative == OP_KETRMIN)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1 + LINK_SIZE;
    break;

    CASE_ITERATOR_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1 + IMM2_SIZE;
    break;

    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
    i = (*cc == OP_XCLASS) ? GET(cc, 1) : 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#else
    i = 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#endif
    if (PRIVATE_DATA(cc) != 0)
      switch(get_class_iterator_size(cc + i))
        {
        case 1:
        private_count = 1;
        private_srcw[0] = PRIVATE_DATA(cc);
        break;

        case 2:
        private_count = 2;
        private_srcw[0] = PRIVATE_DATA(cc);
        private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
        break;

        default:
        SLJIT_UNREACHABLE();
        break;
        }
    cc += i;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (has_quit && !setmark_found)
      {
      kept_shared_srcw[0] = common->mark_ptr;
      kept_shared_count = 1;
      setmark_found = TRUE;
      }
    if (common->control_head_ptr != 0 && !control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_THEN:
    SLJIT_ASSERT(common->control_head_ptr != 0);
    if (!control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc++;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

  if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

    for (i = 0; i < private_count; i++)
      {
      SLJIT_ASSERT(private_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, private_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, private_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * private_count;

  if (type != recurse_copy_private_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_swap_global);

    for (i = 0; i < shared_count; i++)
      {
      SLJIT_ASSERT(shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * shared_count;

  if (type != recurse_copy_private_to_global && type != recurse_swap_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_copy_kept_shared_to_global);

    for (i = 0; i < kept_shared_count; i++)
      {
      SLJIT_ASSERT(kept_shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, kept_shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, kept_shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * kept_shared_count;
  }